

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.cpp
# Opt level: O1

ExprNode * __thiscall Translator::visit(Translator *this,MultiplicationOPNode *multiplicationOPNode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  ESEQ *this_00;
  MOVE *this_01;
  ExprNode *pEVar5;
  BINOP *this_02;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 *puVar4;
  
  iVar1 = (*(this->currentFrame->super_Frame)._vptr_Frame[1])(this->currentFrame,0,1);
  puVar4 = (undefined8 *)CONCAT44(extraout_var,iVar1);
  this_00 = (ESEQ *)operator_new(0x20);
  this_01 = (MOVE *)operator_new(0x20);
  pEVar5 = (ExprNode *)(**(code **)*puVar4)(puVar4);
  this_02 = (BINOP *)operator_new(0x20);
  iVar1 = multiplicationOPNode->op->token;
  iVar2 = (*(multiplicationOPNode->exp1->super_StmtNode).super_ASTNode._vptr_ASTNode[4])
                    (multiplicationOPNode->exp1,this);
  iVar3 = (*(multiplicationOPNode->exp2->super_StmtNode).super_ASTNode._vptr_ASTNode[4])
                    (multiplicationOPNode->exp2,this);
  BINOP::BINOP(this_02,iVar1,(ExprNode *)CONCAT44(extraout_var_00,iVar2),
               (ExprNode *)CONCAT44(extraout_var_01,iVar3));
  MOVE::MOVE(this_01,pEVar5,(ExprNode *)this_02);
  pEVar5 = (ExprNode *)(**(code **)*puVar4)(puVar4);
  ESEQ::ESEQ(this_00,(StmNode *)this_01,pEVar5);
  return &this_00->super_ExprNode;
}

Assistant:

ExprNode *Translator::visit(MultiplicationOPNode *multiplicationOPNode) {
    LocalAccess *tmp = this->currentFrame->addLocal(false, INT8_SIZE);//TODO eh INT8 mesmo?
    return new ESEQ(new MOVE(tmp->accessCode(),
                             new BINOP(multiplicationOPNode->getOp()->getToken(),
                                       multiplicationOPNode->getExp1()->accept(this),
                                       multiplicationOPNode->getExp2()->accept(this))),
                    tmp->accessCode());
//    return new BINOP(multiplicationOPNode->getOp()->getToken(), multiplicationOPNode->getExp1()->accept(this),
//                     multiplicationOPNode->getExp2()->accept(this));
}